

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_handle_certificate(ptls_t *tls,ptls_iovec_t message)

{
  ptls_key_schedule_t *ppVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  size_t sVar4;
  uint8_t *puVar5;
  ptls_hash_context_t **pppVar6;
  int got_certs;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  puVar5 = message.base;
  iVar2 = handle_certificate(tls,puVar5 + 4,puVar5 + message.len,&local_34);
  iVar3 = 0x2f;
  if (local_34 != 0) {
    iVar3 = 0;
  }
  if (iVar2 != 0) {
    iVar3 = iVar2;
  }
  if (iVar3 == 0) {
    ppVar1 = tls->key_schedule;
    if (ppVar1->num_hashes != 0) {
      pppVar6 = &ppVar1->hashes[0].ctx;
      sVar4 = 0;
      do {
        (*(*pppVar6)->update)(*pppVar6,puVar5,message.len);
        sVar4 = sVar4 + 1;
        pppVar6 = pppVar6 + 2;
      } while (sVar4 != ppVar1->num_hashes);
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    iVar3 = 0x202;
  }
  return iVar3;
}

Assistant:

static int client_handle_certificate(ptls_t *tls, ptls_iovec_t message)
{
    int ret;

    if ((ret = client_do_handle_certificate(tls, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len)) != 0)
        return ret;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    return PTLS_ERROR_IN_PROGRESS;
}